

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QInputMethodQueryEvent::QueryPair>::
emplace<QInputMethodQueryEvent::QueryPair_const&>
          (QMovableArrayOps<QInputMethodQueryEvent::QueryPair> *this,qsizetype i,QueryPair *args)

{
  QueryPair **ppQVar1;
  qsizetype *pqVar2;
  long lVar3;
  Data *pDVar4;
  QueryPair *pQVar5;
  qsizetype qVar6;
  long in_FS_OFFSET;
  bool bVar7;
  Inserter local_80;
  QueryPair tmp;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QGenericArrayOps<QInputMethodQueryEvent::QueryPair>).
           super_QArrayDataPointer<QInputMethodQueryEvent::QueryPair>.d;
  if ((pDVar4 != (Data *)0x0) &&
     ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if ((this->super_QGenericArrayOps<QInputMethodQueryEvent::QueryPair>).
        super_QArrayDataPointer<QInputMethodQueryEvent::QueryPair>.size == i) {
      qVar6 = QArrayDataPointer<QInputMethodQueryEvent::QueryPair>::freeSpaceAtEnd
                        ((QArrayDataPointer<QInputMethodQueryEvent::QueryPair> *)this);
      if (qVar6 == 0) goto LAB_002a571f;
      QInputMethodQueryEvent::QueryPair::QueryPair
                ((this->super_QGenericArrayOps<QInputMethodQueryEvent::QueryPair>).
                 super_QArrayDataPointer<QInputMethodQueryEvent::QueryPair>.ptr +
                 (this->super_QGenericArrayOps<QInputMethodQueryEvent::QueryPair>).
                 super_QArrayDataPointer<QInputMethodQueryEvent::QueryPair>.size,args);
LAB_002a585c:
      pqVar2 = &(this->super_QGenericArrayOps<QInputMethodQueryEvent::QueryPair>).
                super_QArrayDataPointer<QInputMethodQueryEvent::QueryPair>.size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_002a581b;
    }
LAB_002a571f:
    if (i == 0) {
      qVar6 = QArrayDataPointer<QInputMethodQueryEvent::QueryPair>::freeSpaceAtBegin
                        ((QArrayDataPointer<QInputMethodQueryEvent::QueryPair> *)this);
      if (qVar6 != 0) {
        QInputMethodQueryEvent::QueryPair::QueryPair
                  ((this->super_QGenericArrayOps<QInputMethodQueryEvent::QueryPair>).
                   super_QArrayDataPointer<QInputMethodQueryEvent::QueryPair>.ptr + -1,args);
        ppQVar1 = &(this->super_QGenericArrayOps<QInputMethodQueryEvent::QueryPair>).
                   super_QArrayDataPointer<QInputMethodQueryEvent::QueryPair>.ptr;
        *ppQVar1 = *ppQVar1 + -1;
        goto LAB_002a585c;
      }
    }
  }
  tmp.value.d._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  tmp.value.d.data._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  tmp.value.d.data._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  tmp._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  tmp.value.d.data.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  QInputMethodQueryEvent::QueryPair::QueryPair(&tmp,args);
  bVar7 = (this->super_QGenericArrayOps<QInputMethodQueryEvent::QueryPair>).
          super_QArrayDataPointer<QInputMethodQueryEvent::QueryPair>.size != 0;
  QArrayDataPointer<QInputMethodQueryEvent::QueryPair>::detachAndGrow
            ((QArrayDataPointer<QInputMethodQueryEvent::QueryPair> *)this,(uint)(i == 0 && bVar7),1,
             (QueryPair **)0x0,(QArrayDataPointer<QInputMethodQueryEvent::QueryPair> *)0x0);
  if (i == 0 && bVar7) {
    pQVar5 = (this->super_QGenericArrayOps<QInputMethodQueryEvent::QueryPair>).
             super_QArrayDataPointer<QInputMethodQueryEvent::QueryPair>.ptr;
    pQVar5[-1].query = tmp.query;
    *(undefined8 *)((long)&pQVar5[-1].value.d.data + 0x10) = tmp.value.d.data._16_8_;
    *(undefined8 *)&pQVar5[-1].value.d.field_0x18 = tmp.value.d._24_8_;
    pQVar5[-1].value.d.data.shared = tmp.value.d.data.shared;
    *(undefined8 *)((long)&pQVar5[-1].value.d.data + 8) = tmp.value.d.data._8_8_;
    tmp.value.d.data.shared = (PrivateShared *)0x0;
    tmp.value.d.data._8_8_ = 0;
    tmp.value.d.data._16_8_ = 0;
    tmp.value.d._24_8_ = 2;
    ppQVar1 = &(this->super_QGenericArrayOps<QInputMethodQueryEvent::QueryPair>).
               super_QArrayDataPointer<QInputMethodQueryEvent::QueryPair>.ptr;
    *ppQVar1 = *ppQVar1 + -1;
    pqVar2 = &(this->super_QGenericArrayOps<QInputMethodQueryEvent::QueryPair>).
              super_QArrayDataPointer<QInputMethodQueryEvent::QueryPair>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    Inserter::Inserter(&local_80,(QArrayDataPointer<QInputMethodQueryEvent::QueryPair> *)this,i,1);
    (local_80.displaceFrom)->query = tmp.query;
    *(undefined8 *)((long)&((local_80.displaceFrom)->value).d.data + 0x10) = tmp.value.d.data._16_8_
    ;
    *(undefined8 *)&((local_80.displaceFrom)->value).d.field_0x18 = tmp.value.d._24_8_;
    ((local_80.displaceFrom)->value).d.data.shared = tmp.value.d.data.shared;
    *(undefined8 *)((long)&((local_80.displaceFrom)->value).d.data + 8) = tmp.value.d.data._8_8_;
    tmp.value.d.data.shared = (PrivateShared *)0x0;
    tmp.value.d.data._8_8_ = 0;
    tmp.value.d.data._16_8_ = 0;
    tmp.value.d._24_8_ = 2;
    local_80.displaceFrom = local_80.displaceFrom + 1;
    Inserter::~Inserter(&local_80);
  }
  ::QVariant::~QVariant(&tmp.value);
LAB_002a581b:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }